

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O2

void JsUtil::
     QuickSort<Memory::_no_write_barrier_policy,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp:311:42)>
     ::Sort(char *base,ulong nmemb)

{
  char *pcVar1;
  char *b;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  
LAB_002e4e69:
  if (base != (char *)0x0) {
    if (9 < nmemb) goto code_r0x002e4e80;
    switch(nmemb) {
    case 2:
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (-1 < iVar3) {
        return;
      }
      pcVar7 = base + 8;
      goto LAB_002e5c96;
    case 3:
      pcVar7 = base + 8;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)(base + 8));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,base + 0x10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      break;
    case 4:
      pcVar5 = base + 8;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
      }
      pcVar8 = base + 0x18;
      pcVar7 = base + 0x10;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x18),*(char16_t **)(base + 0x10));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar5);
      goto joined_r0x002e59d2;
    case 5:
      pcVar5 = base + 8;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
      }
      pcVar8 = base + 0x20;
      pcVar2 = base + 0x18;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x20),*(char16_t **)(base + 0x18));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar8,8);
      }
      pcVar7 = base + 0x10;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x20),*(char16_t **)(base + 0x10));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar7);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x18),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar5);
      goto joined_r0x002e5254;
    case 6:
      pcVar5 = base + 0x10;
      pcVar2 = base + 8;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)(base + 8));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar5,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar2,8);
      }
      pcVar8 = base + 0x28;
      pcVar9 = base + 0x20;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x28),*(char16_t **)(base + 0x20));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar8,8);
      }
      pcVar7 = base + 0x18;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x28),*(char16_t **)(base + 0x18));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar7);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x18),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar2);
joined_r0x002e5254:
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base + 8,base + 0x18,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar5);
      base = pcVar5;
      break;
    case 7:
      pcVar5 = base + 0x10;
      pcVar2 = base + 8;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)(base + 8));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar5,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar2,8);
      }
      pcVar8 = base + 0x20;
      pcVar7 = base + 0x18;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x20),*(char16_t **)(base + 0x18));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar8,8);
      }
      pcVar9 = base + 0x30;
      pcVar10 = base + 0x28;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x30),*(char16_t **)(base + 0x28));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar10,*(char16_t **)pcVar7);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar8);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar10,*(char16_t **)pcVar8);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x20),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x18),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar10,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar10,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar5);
joined_r0x002e59d2:
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar5);
      base = pcVar5;
      break;
    case 8:
      pcVar5 = base + 8;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
      }
      pcVar2 = base + 0x18;
      pcVar8 = base + 0x10;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x18),*(char16_t **)(base + 0x10));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar8,8);
      }
      pcVar9 = base + 0x28;
      pcVar7 = base + 0x20;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x28),*(char16_t **)(base + 0x20));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar9,8);
      }
      pcVar10 = base + 0x38;
      pcVar1 = base + 0x30;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x38),*(char16_t **)(base + 0x30));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar1,*(char16_t **)pcVar7);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar1,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar10,*(char16_t **)pcVar9);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar1,*(char16_t **)pcVar9);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar1,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x20),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar1,*(char16_t **)pcVar8);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar1,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar10,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar10,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar1,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar1,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar8);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar2);
      base = pcVar2;
      break;
    case 9:
      pcVar5 = base + 8;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
      }
      pcVar2 = base + 0x20;
      pcVar8 = base + 0x18;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x20),*(char16_t **)(base + 0x18));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar2,8);
      }
      pcVar9 = base + 0x38;
      pcVar7 = base + 0x30;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x38),*(char16_t **)(base + 0x30));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar9,8);
      }
      pcVar10 = base + 0x10;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x10),*(char16_t **)(base + 8));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar10,8);
      }
      pcVar1 = base + 0x28;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x28),*(char16_t **)(base + 0x20));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar1,8);
      }
      b = base + 0x40;
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x40),*(char16_t **)(base + 0x38));
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,b,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 8),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar8);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar7);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x18),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar8);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)(base + 0x18),*(char16_t **)base);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar1,*(char16_t **)pcVar10);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar1,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)b,*(char16_t **)pcVar1);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,b,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar1,*(char16_t **)pcVar10);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar1,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar5);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar9,*(char16_t **)pcVar1);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar9,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar10);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar2);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar7,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar10);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar2,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar10);
      if (iVar3 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar10,pcVar8,8);
      }
      iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar1);
      base = pcVar1;
      break;
    default:
      goto switchD_002e50cc_default;
    }
    if (iVar3 < 0) {
LAB_002e5c96:
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
      return;
    }
  }
switchD_002e50cc_default:
  return;
code_r0x002e4e80:
  pcVar5 = base + (nmemb & 0xfffffffffffffffc) * 2;
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar5,*(char16_t **)base);
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar5,8);
  }
  pcVar8 = base + nmemb * 8 + -8;
  uVar4 = nmemb * 6 & 0xfffffffffffffff8;
  pcVar2 = base + uVar4;
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)(base + uVar4));
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar2,pcVar8,8);
  }
  uVar4 = nmemb * 4 & 0xfffffffffffffff8;
  pcVar7 = base + uVar4;
  iVar3 = PAL_wcscmp(*(char16_t **)(base + nmemb * 8 + -8),*(char16_t **)(base + uVar4));
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar8,8);
  }
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar7);
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar7,pcVar2,8);
  }
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)base);
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar2,8);
  }
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)base);
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar7,8);
  }
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar8,*(char16_t **)pcVar5);
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar8,8);
  }
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar2,*(char16_t **)pcVar5);
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar2,8);
  }
  iVar3 = PAL_wcscmp(*(char16_t **)pcVar7,*(char16_t **)pcVar5);
  if (iVar3 < 0) {
    QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar5,pcVar7,8);
  }
  QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar8,pcVar7,8);
  lVar11 = 0;
  for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 8) {
    iVar3 = PAL_wcscmp(*(char16_t **)(base + uVar6),*(char16_t **)pcVar8);
    if (iVar3 < 1) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base + uVar6,base + lVar11 * 8,8);
      lVar11 = lVar11 + 1;
    }
  }
  for (; uVar6 < nmemb * 8 - 8; uVar6 = uVar6 + 8) {
    iVar3 = PAL_wcscmp(*(char16_t **)(base + uVar6),*(char16_t **)pcVar8);
    if (iVar3 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base + uVar6,base + lVar11 * 8,8);
      lVar11 = lVar11 + 1;
    }
  }
  QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base + lVar11 * 8,pcVar8,8);
  Sort(base,lVar11);
  base = base + lVar11 * 8 + 8;
  nmemb = nmemb - (lVar11 + 1);
  goto LAB_002e4e69;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }